

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xDisassembler.c
# Opt level: O1

_Bool TMS320C64x_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *MI,uint16_t *size,uint64_t address,
                void *info)

{
  byte bVar1;
  cs_detail *__s;
  uint8_t *puVar2;
  _Bool _Var3;
  DecodeStatus DVar4;
  uint8_t *orig_p;
  byte bVar5;
  uint16_t uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  void *Decoder;
  uint uVar10;
  uint8_t *orig_p_2;
  uint8_t *puVar11;
  long lVar12;
  byte *pbVar13;
  uint uVar14;
  uint64_t Value_4;
  DecodeStatus local_3c;
  
  if (3 < code_len) {
    __s = MI->flat_insn->detail;
    Decoder = (void *)address;
    if (__s != (cs_detail *)0x0) {
      memset(__s,0,0x174);
    }
    uVar8 = *(uint *)code;
    uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
    uVar10 = 0;
    local_3c = MCDisassembler_Success;
    puVar2 = DecoderTable32;
LAB_0026cd3e:
    puVar11 = puVar2;
    switch(*puVar11) {
    case '\x01':
      uVar10 = ~(-1 << (puVar11[2] & 0x1f)) << (puVar11[1] & 0x1f);
      if (puVar11[2] == 0x20) {
        uVar10 = 0xffffffff;
      }
      uVar10 = (uVar10 & uVar8) >> (puVar11[1] & 0x1f);
      puVar2 = puVar11 + 3;
      goto LAB_0026cd3e;
    case '\x02':
      uVar9 = 0;
      Decoder = (void *)0x0;
      bVar5 = 0;
      do {
        lVar7 = uVar9 + 1;
        Decoder = (void *)((long)Decoder + ((ulong)(puVar11[lVar7] & 0x7f) << (bVar5 & 0x3f)));
        bVar5 = bVar5 + 7;
        uVar9 = uVar9 + 1;
      } while ((char)puVar11[lVar7] < '\0');
      puVar2 = puVar11 + (uVar9 & 0xffffffff) + 3;
      if (uVar10 != (uint)Decoder) {
        puVar2 = puVar11 + (uVar9 & 0xffffffff) + 3 +
                 *(ushort *)(puVar11 + (uVar9 & 0xffffffff) + 1);
      }
      goto LAB_0026cd3e;
    case '\x03':
      uVar14 = ~(-1 << (puVar11[2] & 0x1f)) << (puVar11[1] & 0x1f);
      if (puVar11[2] == 0x20) {
        uVar14 = 0xffffffff;
      }
      uVar9 = 0;
      Decoder = (void *)0x0;
      bVar5 = 0;
      do {
        lVar7 = uVar9 + 3;
        Decoder = (void *)((long)Decoder + ((ulong)(puVar11[lVar7] & 0x7f) << (bVar5 & 0x3f)));
        bVar5 = bVar5 + 7;
        uVar9 = uVar9 + 1;
      } while ((char)puVar11[lVar7] < '\0');
      puVar2 = puVar11 + (uVar9 & 0xffffffff) + 5;
      if ((uVar14 & uVar8) >> (puVar11[1] & 0x1f) != (uint)Decoder) {
        puVar2 = puVar11 + (uVar9 & 0xffffffff) + 5 +
                 *(ushort *)(puVar11 + (uVar9 & 0xffffffff) + 3);
      }
      goto LAB_0026cd3e;
    case '\x04':
      uVar9 = 0;
      do {
        lVar7 = uVar9 + 1;
        uVar9 = uVar9 + 1;
      } while ((char)puVar11[lVar7] < '\0');
      puVar2 = puVar11 + (uVar9 & 0xffffffff) + 3;
      goto LAB_0026cd3e;
    case '\x05':
      goto switchD_0026cd54_caseD_5;
    case '\x06':
      uVar9 = 0;
      lVar7 = 0;
      bVar5 = 0;
      do {
        lVar12 = uVar9 + 1;
        lVar7 = lVar7 + ((ulong)(puVar11[lVar12] & 0x7f) << (bVar5 & 0x3f));
        bVar5 = bVar5 + 7;
        uVar9 = uVar9 + 1;
      } while ((char)puVar11[lVar12] < '\0');
      Decoder = (void *)0x0;
      lVar12 = 0;
      bVar5 = 0;
      do {
        pbVar13 = puVar11 + (uVar9 & 0xffffffff) + 1 + (long)Decoder;
        lVar12 = lVar12 + ((ulong)(*pbVar13 & 0x7f) << (bVar5 & 0x3f));
        bVar5 = bVar5 + 7;
        Decoder = (void *)((long)Decoder + 1);
      } while ((char)*pbVar13 < '\0');
      puVar2 = puVar11 + ((ulong)Decoder & 0xffffffff) + (uVar9 & 0xffffffff) + 1;
      if (((uint)lVar12 & ~uVar8) != 0 || ((uint)lVar7 & uVar8) != 0) {
        local_3c = MCDisassembler_SoftFail;
      }
      goto LAB_0026cd3e;
    default:
      goto switchD_0026cd54_default;
    }
  }
LAB_0026cf59:
  uVar6 = 0;
  _Var3 = false;
LAB_0026cf5d:
  *size = uVar6;
  return _Var3;
switchD_0026cd54_caseD_5:
  uVar9 = 0;
  lVar7 = 0;
  bVar5 = 0;
  do {
    lVar12 = uVar9 + 1;
    lVar7 = lVar7 + ((ulong)(puVar11[lVar12] & 0x7f) << (bVar5 & 0x3f));
    bVar5 = bVar5 + 7;
    uVar9 = uVar9 + 1;
  } while ((char)puVar11[lVar12] < '\0');
  pbVar13 = puVar11 + (uVar9 & 0xffffffff) + 1;
  lVar12 = 0;
  bVar5 = 0;
  do {
    bVar1 = *pbVar13;
    lVar12 = lVar12 + ((ulong)(bVar1 & 0x7f) << (bVar5 & 0x3f));
    bVar5 = bVar5 + 7;
    pbVar13 = pbVar13 + 1;
  } while ((char)bVar1 < '\0');
  MCInst_setOpcode(MI,(uint)lVar7);
  DVar4 = decodeToMCInst_4(local_3c,(uint)lVar12,uVar8,MI,address,Decoder);
  if (DVar4 == MCDisassembler_Success) {
    _Var3 = true;
    uVar6 = 4;
    goto LAB_0026cf5d;
  }
switchD_0026cd54_default:
  MCInst_clear(MI);
  goto LAB_0026cf59;
}

Assistant:

bool TMS320C64x_getInstruction(csh ud, const uint8_t *code, size_t code_len,
		MCInst *MI, uint16_t *size, uint64_t address, void *info)
{
	uint32_t insn;
	DecodeStatus result;

	if(code_len < 4) {
		*size = 0;
		return MCDisassembler_Fail;
	}

	if(MI->flat_insn->detail)
		memset(MI->flat_insn->detail, 0, offsetof(cs_detail, tms320c64x)+sizeof(cs_tms320c64x));

	insn = (code[3] << 0) | (code[2] << 8) | (code[1] << 16) | ((uint32_t) code[0] << 24);
	result = decodeInstruction_4(DecoderTable32, MI, insn, address, info, 0);

	if(result == MCDisassembler_Success) {
		*size = 4;
		return true;
	}

	MCInst_clear(MI);
	*size = 0;
	return false;
}